

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_base.cpp
# Opt level: O3

void __thiscall zmq::session_base_t::attach_pipe(session_base_t *this,pipe_t *pipe_)

{
  bool bVar1;
  
  bVar1 = own_t::is_terminating(&this->super_own_t);
  if (bVar1) {
    attach_pipe();
  }
  if (this->_pipe != (pipe_t *)0x0) {
    attach_pipe();
  }
  if (pipe_ == (pipe_t *)0x0) {
    attach_pipe();
  }
  this->_pipe = pipe_;
  pipe_t::set_event_sink(pipe_,&this->super_i_pipe_events);
  return;
}

Assistant:

void zmq::session_base_t::attach_pipe (pipe_t *pipe_)
{
    zmq_assert (!is_terminating ());
    zmq_assert (!_pipe);
    zmq_assert (pipe_);
    _pipe = pipe_;
    _pipe->set_event_sink (this);
}